

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_itoa(char *s,int value,size_t offset,size_t bufsiz)

{
  size_t sVar1;
  ulong in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  ssize_t result;
  size_t loc;
  ulong local_30;
  int local_14;
  ulong local_8;
  
  sVar1 = zt_cstr_int_display_len(in_ESI);
  local_8 = in_RDX + sVar1;
  if ((in_RDI == 0) || (in_RCX < local_8)) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_ESI < 0) {
      *(undefined1 *)(in_RDI + in_RDX) = 0x2d;
    }
    *(undefined1 *)(in_RDI + local_8) = 0;
    local_14 = in_ESI;
    local_30 = local_8;
    do {
      local_30 = local_30 - 1;
      *(char *)(in_RDI + local_30) = _itoa_integers[(long)(local_14 % 10) + 9];
      local_14 = local_14 / 10;
    } while (local_14 != 0);
  }
  return local_8;
}

Assistant:

ssize_t zt_cstr_itoa(char *s, int value, size_t offset, size_t bufsiz)
{
    size_t    loc;
    ssize_t   result;

    result = loc = offset + zt_cstr_int_display_len(value);

    if ((s == NULL) || (loc > bufsiz)) {
        return -1;
    }

    if (value < 0) {
        s[offset] = '-';
    }

    s[loc] = 0;
    loc--;

    do {
        s[loc] = *(_itoa_integers + 9 + (value % 10));
        value /= 10;
        loc--;
    } while(value != 0);

    return result;
}